

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFileOpenDialog.cpp
# Opt level: O2

void __thiscall irr::gui::CGUIFileOpenDialog::fillListBox(CGUIFileOpenDialog *this)

{
  _Alloc_hider _Var1;
  int iVar2;
  uint uVar3;
  long *plVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  u32 i;
  uint uVar6;
  IGUIListBox *pIVar7;
  stringw s;
  stringw local_50;
  IFileList *pIVar5;
  
  plVar4 = (long *)(**(code **)(**(long **)&this->field_0x128 + 0x60))();
  if ((this->FileSystem != (IFileSystem *)0x0) &&
     (pIVar7 = this->FileBox, plVar4 != (long *)0x0 && pIVar7 != (IGUIListBox *)0x0)) {
    pIVar5 = this->FileList;
    if (pIVar5 != (IFileList *)0x0) {
      IReferenceCounted::drop
                ((IReferenceCounted *)
                 ((long)&pIVar5->_vptr_IFileList + (long)pIVar5->_vptr_IFileList[-3]));
      pIVar7 = this->FileBox;
    }
    (*(pIVar7->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x2c])();
    iVar2 = (*this->FileSystem->_vptr_IFileSystem[0x18])();
    pIVar5 = (IFileList *)CONCAT44(extraout_var,iVar2);
    this->FileList = pIVar5;
    local_50.str._M_dataplus._M_p = (pointer)&local_50.str.field_2;
    local_50.str._M_string_length = 0;
    local_50.str.field_2._M_local_buf[0] = L'\0';
    if (pIVar5 != (IFileList *)0x0) {
      uVar6 = 0;
      while( true ) {
        uVar3 = (**pIVar5->_vptr_IFileList)();
        if (uVar3 <= uVar6) break;
        iVar2 = (*this->FileList->_vptr_IFileList[1])(this->FileList,(ulong)uVar6);
        core::multibyteToWString(&local_50,(stringc *)CONCAT44(extraout_var_00,iVar2));
        _Var1._M_p = local_50.str._M_dataplus._M_p;
        pIVar7 = this->FileBox;
        uVar3 = (*this->FileList->_vptr_IFileList[6])(this->FileList,(ulong)uVar6);
        uVar3 = (**(code **)(*plVar4 + 0x50))(plVar4,(uVar3 & 0xff) + 0x15);
        (*(pIVar7->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x27])
                  (pIVar7,_Var1._M_p,(ulong)uVar3);
        uVar6 = uVar6 + 1;
        pIVar5 = this->FileList;
      }
    }
    if (this->FileNameText != (IGUIEditBox *)0x0) {
      iVar2 = (*this->FileSystem->_vptr_IFileSystem[0x11])();
      setDirectoryName(this,(path *)CONCAT44(extraout_var_01,iVar2));
      core::multibyteToWString(&local_50,&this->FileDirectory);
      (*(this->FileNameText->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x14])
                (this->FileNameText,local_50.str._M_dataplus._M_p);
    }
    ::std::__cxx11::wstring::_M_dispose();
  }
  return;
}

Assistant:

void CGUIFileOpenDialog::fillListBox()
{
	IGUISkin *skin = Environment->getSkin();

	if (!FileSystem || !FileBox || !skin)
		return;

	if (FileList)
		FileList->drop();

	FileBox->clear();

	FileList = FileSystem->createFileList();
	core::stringw s;

	if (FileList) {
		for (u32 i = 0; i < FileList->getFileCount(); ++i) {
			pathToStringW(s, FileList->getFileName(i));
			FileBox->addItem(s.c_str(), skin->getIcon(FileList->isDirectory(i) ? EGDI_DIRECTORY : EGDI_FILE));
		}
	}

	if (FileNameText) {
		setDirectoryName(FileSystem->getWorkingDirectory());
		pathToStringW(s, FileDirectory);
		FileNameText->setText(s.c_str());
	}
}